

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  sqlite3_value *local_60;
  sqlite3_value *pC2;
  sqlite3_value *pC1;
  int iStack_44;
  uchar firstChar;
  int isText;
  int N;
  int typeNeedle;
  int typeHaystack;
  int nNeedle;
  int nHaystack;
  uchar *zNeedle;
  uchar *zHaystack;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iStack_44 = 1;
  pC2 = (sqlite3_value *)0x0;
  local_60 = (sqlite3_value *)0x0;
  iVar3 = sqlite3_value_type(*argv);
  iVar4 = sqlite3_value_type(argv[1]);
  if (iVar3 == 5) {
    return;
  }
  if (iVar4 == 5) {
    return;
  }
  typeHaystack = sqlite3_value_bytes(*argv);
  typeNeedle = sqlite3_value_bytes(argv[1]);
  if (typeNeedle < 1) {
LAB_001f75af:
    sqlite3_result_int(context,iStack_44);
  }
  else {
    if ((iVar3 == 4) && (iVar4 == 4)) {
      zNeedle = (uchar *)sqlite3_value_blob(*argv);
      _nNeedle = (uchar *)sqlite3_value_blob(argv[1]);
      bVar2 = false;
LAB_001f74e6:
      if ((_nNeedle != (uchar *)0x0) && ((typeHaystack == 0 || (zNeedle != (uchar *)0x0)))) {
        uVar1 = *_nNeedle;
        while( true ) {
          bVar5 = false;
          if ((typeNeedle <= typeHaystack) && (bVar5 = true, *zNeedle == uVar1)) {
            iVar3 = memcmp(zNeedle,_nNeedle,(long)typeNeedle);
            bVar5 = iVar3 != 0;
          }
          if (!bVar5) break;
          iStack_44 = iStack_44 + 1;
          do {
            typeHaystack = typeHaystack + -1;
            zNeedle = zNeedle + 1;
            bVar5 = false;
            if (bVar2) {
              bVar5 = (*zNeedle & 0xc0) == 0x80;
            }
          } while (bVar5);
        }
        if (typeHaystack < typeNeedle) {
          iStack_44 = 0;
        }
        goto LAB_001f75af;
      }
    }
    else {
      if ((iVar3 != 4) && (iVar4 != 4)) {
        zNeedle = sqlite3_value_text(*argv);
        _nNeedle = sqlite3_value_text(argv[1]);
LAB_001f74e4:
        bVar2 = true;
        goto LAB_001f74e6;
      }
      pC2 = sqlite3_value_dup(*argv);
      zNeedle = sqlite3_value_text(pC2);
      if (zNeedle != (uchar *)0x0) {
        typeHaystack = sqlite3_value_bytes(pC2);
        local_60 = sqlite3_value_dup(argv[1]);
        _nNeedle = sqlite3_value_text(local_60);
        if (_nNeedle != (uchar *)0x0) {
          typeNeedle = sqlite3_value_bytes(local_60);
          goto LAB_001f74e4;
        }
      }
    }
    sqlite3_result_error_nomem(context);
  }
  sqlite3_value_free(pC2);
  sqlite3_value_free(local_60);
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;
  sqlite3_value *pC1 = 0;
  sqlite3_value *pC2 = 0;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else if( typeHaystack!=SQLITE_BLOB && typeNeedle!=SQLITE_BLOB ){
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }else{
      pC1 = sqlite3_value_dup(argv[0]);
      zHaystack = sqlite3_value_text(pC1);
      if( zHaystack==0 ) goto endInstrOOM;
      nHaystack = sqlite3_value_bytes(pC1);
      pC2 = sqlite3_value_dup(argv[1]);
      zNeedle = sqlite3_value_text(pC2);
      if( zNeedle==0 ) goto endInstrOOM;
      nNeedle = sqlite3_value_bytes(pC2);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) goto endInstrOOM;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
endInstr:
  sqlite3_value_free(pC1);
  sqlite3_value_free(pC2);
  return;
endInstrOOM:
  sqlite3_result_error_nomem(context);
  goto endInstr;
}